

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.cpp
# Opt level: O3

int UTF8ToUnicode(LPCSTR lpSrcStr,int cchSrc,LPWSTR lpDestStr,int cchDest,DWORD dwFlags)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  DWORD dwErrCode;
  int iVar8;
  int iVar9;
  uint uVar10;
  
  dwErrCode = 0x459;
  if (cchSrc == 0) goto LAB_001d014c;
  bVar2 = false;
  uVar10 = 0;
  iVar3 = 0;
  iVar5 = 0;
LAB_001cff8e:
  iVar8 = cchSrc + -1;
  bVar1 = *lpSrcStr;
  if ((char)bVar1 < '\0') {
    if ((bVar1 & 0x40) != 0) {
      if (iVar5 < 1) {
        iVar5 = -1;
        bVar4 = bVar1;
        do {
          iVar9 = iVar5;
          bVar4 = bVar4 * '\x02';
          iVar5 = iVar9 + 1;
        } while ((char)bVar4 < '\0');
        uVar7 = (uint)(bVar4 >> ((char)iVar9 + 2U & 0x1f));
        if (iVar5 == 3) {
          iVar5 = 3;
          if (2 < iVar8) {
            if (((CONCAT11(bVar1,((byte *)lpSrcStr)[1]) & 0x730) == 0) ||
               (((bVar1 & 4) != 0 && ((CONCAT11(bVar1,((byte *)lpSrcStr)[1]) & 0x330) != 0))))
            goto LAB_001d00ed;
            bVar2 = true;
          }
        }
        else if (iVar5 == 2) {
          iVar5 = 2;
          if ((1 < iVar8) && ((bVar1 & 0xf) == 0)) {
            bVar1 = ((byte *)lpSrcStr)[1] & 0x20;
            goto joined_r0x001d00ba;
          }
        }
        else {
          if (iVar5 == 1) {
            iVar5 = 1;
            bVar1 = bVar1 & 0x1e;
joined_r0x001d00ba:
            if (bVar1 != 0) goto LAB_001cffb9;
          }
LAB_001d00ed:
          if ((dwFlags & 8) != 0) goto LAB_001d014c;
          iVar5 = 0;
          uVar7 = uVar10;
        }
      }
      else {
        if ((dwFlags & 8) != 0) goto LAB_001d014c;
        lpSrcStr = (LPCSTR)((byte *)lpSrcStr + -1);
        iVar5 = 0;
        bVar2 = false;
        iVar8 = cchSrc;
        uVar7 = uVar10;
      }
      goto LAB_001cffb9;
    }
    if (iVar5 == 0) {
      if ((dwFlags & 8) != 0) goto LAB_001d014c;
    }
    else {
      uVar6 = uVar10 * 0x40;
      uVar10 = bVar1 & 0x3f | uVar6;
      iVar5 = iVar5 + -1;
      uVar7 = uVar10;
      if (iVar5 != 0) goto LAB_001cffb9;
      if (bVar2) {
        if (cchDest != 0) {
          if (cchDest <= iVar3 + 1) {
LAB_001d0147:
            dwErrCode = 0x7a;
            goto LAB_001d014c;
          }
          lpDestStr[iVar3] = (short)(uVar6 + 0x3ff0000 >> 10) + L'\xd800';
          lpDestStr[iVar3 + 1] = (ushort)(bVar1 & 0x3f) | (ushort)uVar6 & 0x3ff | 0xdc00;
        }
        iVar3 = iVar3 + 2;
        goto LAB_001cffb6;
      }
      if (cchDest != 0) {
        if (cchDest <= iVar3) goto LAB_001d0147;
        lpDestStr[iVar3] = (WCHAR)uVar10;
      }
      iVar3 = iVar3 + 1;
    }
  }
  else {
    if (cchDest != 0) {
      if (cchDest <= iVar3) goto LAB_001d0147;
      lpDestStr[iVar3] = (short)(char)bVar1;
    }
    iVar3 = iVar3 + 1;
  }
LAB_001cffb6:
  iVar5 = 0;
  bVar2 = false;
  uVar7 = uVar10;
LAB_001cffb9:
  uVar10 = uVar7;
  lpSrcStr = (LPCSTR)((byte *)lpSrcStr + 1);
  cchSrc = iVar8;
  if (iVar8 == 0) goto LAB_001d012c;
  goto LAB_001cff8e;
LAB_001d012c:
  if ((byte)(iVar3 == 0 | (byte)dwFlags >> 3 & iVar5 != 0) != 1) {
    return iVar3;
  }
LAB_001d014c:
  SetLastError(dwErrCode);
  return 0;
}

Assistant:

int UTF8ToUnicode(
    LPCSTR lpSrcStr,
    int cchSrc,
    LPWSTR lpDestStr,
    int cchDest,
    DWORD dwFlags
    )
{
    int nTB = 0;                   // # trail bytes to follow
    int cchWC = 0;                 // # of Unicode code points generated
    CONST BYTE* pUTF8 = (CONST BYTE*)lpSrcStr;
    DWORD dwUnicodeChar = 0;       // Our character with room for full surrogate char
    BOOL bSurrogatePair = FALSE;   // Indicate we're collecting a surrogate pair
    BOOL bCheckInvalidBytes = (dwFlags & MB_ERR_INVALID_CHARS);
    BYTE UTF8;

    // Note that we can't test destination buffer length here because we may have to
    // iterate through thousands of broken characters which won't be output, even though
    // the buffer has no more room.
    while (cchSrc--)
    {
        //
        //  See if there are any trail bytes.
        //
        if (BIT7(*pUTF8) == 0)
        {
            //
            //  Found ASCII.
            //
            if (cchDest)
            {
                // In this function always test buffer size before using it
                if (cchWC >= cchDest)
                {
                    // Error: Buffer too small, we didn't process this character
                    SetLastError(ERROR_INSUFFICIENT_BUFFER);
                    return (0);
                }
                lpDestStr[cchWC] = (WCHAR)*pUTF8;
            }
            nTB = bSurrogatePair = 0;
            cchWC++;
        }
        else if (BIT6(*pUTF8) == 0)
        {
            //
            //  Found a trail byte.
            //  Note : Ignore the trail byte if there was no lead byte.
            //
            if (nTB != 0)
            {
                //
                //  Decrement the trail byte counter.
                //
                nTB--;

                // Add room for trail byte and add the trail byte falue
                dwUnicodeChar <<= 6;
                dwUnicodeChar |= LOWER_6_BIT(*pUTF8);

                // If we're done then we may need to store the data
                if (nTB == 0)
                {
                    if (bSurrogatePair)
                    {
                        if (cchDest)
                        {
                            if ((cchWC + 1) >= cchDest)
                            {
                                // Error: Buffer too small, we didn't process this character
                                SetLastError(ERROR_INSUFFICIENT_BUFFER);
                                return (0);
                            }                                

                            lpDestStr[cchWC]   = (WCHAR)
                                                 (((dwUnicodeChar - 0x10000) >> 10) + HIGH_SURROGATE_START);

                            lpDestStr[cchWC+1] = (WCHAR)
                                                 ((dwUnicodeChar - 0x10000)%0x400 + LOW_SURROGATE_START);
                        }

                        //
                        //  End of sequence.  Advance the output counter, turn off surrogateness
                        //
                        cchWC += 2;
                        bSurrogatePair = FALSE;
                    }
                    else
                    {
                        if (cchDest)
                        {
                            
                            if (cchWC >= cchDest)
                            {
                                // Error: Buffer too small, we didn't process this character
                                SetLastError(ERROR_INSUFFICIENT_BUFFER);
                                return (0);
                            }

                            lpDestStr[cchWC] = (WCHAR)dwUnicodeChar;
                        }

                        //
                        //  End of sequence.  Advance the output counter.
                        //
                        cchWC++;
                    }
                      
                }

            }
            else
            {
                if (bCheckInvalidBytes) 
                {
                    SetLastError(ERROR_NO_UNICODE_TRANSLATION);
                    return (0);
                }
                
                // error - not expecting a trail byte. That is, there is a trailing byte without leading byte.
                bSurrogatePair = FALSE;
            }
        }
        else
        {
            //
            //  Found a lead byte.
            //
            if (nTB > 0)
            {
                // error - A leading byte before the previous sequence is completed.
                if (bCheckInvalidBytes) 
                {
                    SetLastError(ERROR_NO_UNICODE_TRANSLATION);
                    return (0);
                }
                //
                //  Error - previous sequence not finished.
                //
                nTB = 0;
                bSurrogatePair = FALSE;
                // Put this character back so that we can start over another sequence.
                cchSrc++;
                pUTF8--;
            }
            else
            {
                //
                //  Calculate the number of bytes to follow.
                //  Look for the first 0 from left to right.
                //
                UTF8 = *pUTF8;
                while (BIT7(UTF8) != 0)
                {
                    UTF8 <<= 1;
                    nTB++;
                }

                // Recover the data from the byte
                UTF8 >>= nTB;

                //
                // Check for non-shortest form.
                // 
                switch (nTB)
                {
                    case 1:
                        nTB = 0;
                        break;
                    case 2:
                        // Make sure that bit 8 ~ bit 11 is not all zero.
                        // 110XXXXx 10xxxxxx
                        if ((*pUTF8 & 0x1e) == 0)
                        {
                            nTB = 0;
                        }
                        break;
                    case 3:
                        // Look ahead to check for non-shortest form.
                        // 1110XXXX 10Xxxxxx 10xxxxxx
                        if (cchSrc >= 2)
                        {
                            if (((*pUTF8 & 0x0f) == 0) && (*(pUTF8 + 1) & 0x20) == 0)
                            {
                                nTB = 0;
                            }
                        }
                        break;
                    case 4:                    
                        //
                        // This is a surrogate unicode pair
                        //
                        if (cchSrc >= 3)
                        {
                            WORD word = (((WORD)*pUTF8) << 8) | *(pUTF8 + 1);
                            // Look ahead to check for non-shortest form.
                            // 11110XXX 10XXxxxx 10xxxxxx 10xxxxxx                        
                            // Check if the 5 X bits are all zero.
                            // 0x0730 == 00000111 00110000
                            if ( (word & 0x0730) == 0 ||
                                  // If the 21st bit is 1, we have extra work
                                  ( (word & 0x0400) == 0x0400 &&
                                     // The 21st bit is 1.
                                     // Make sure that the resulting Unicode is within the valid surrogate range.
                                     // The 4 byte code sequence can hold up to 21 bits, and the maximum valid code point range
                                     // that Unicode (with surrogate) could represent are from U+000000 ~ U+10FFFF.
                                     // Therefore, if the 21 bit (the most significant bit) is 1, we should verify that the 17 ~ 20
                                     // bit are all zero.
                                     // I.e., in 11110XXX 10XXxxxx 10xxxxxx 10xxxxxx,
                                     // XXXXX can only be 10000.    
                                     // 0x0330 = 0000 0011 0011 0000
                                    (word & 0x0330) != 0 ) )
                            {
                                // Not shortest form
                                nTB = 0;
                            }                              
                            else
                            { 
                                // A real surrogate pair
                                bSurrogatePair = TRUE;
                            }
                        }                        
                        break;
                    default:                    
                        // 
                        // If the bits is greater than 4, this is an invalid
                        // UTF8 lead byte.
                        //
                        nTB = 0;
                        break;
                }

                if (nTB != 0) 
                {
                    //
                    //  Store the value from the first byte and decrement
                    //  the number of bytes to follow.
                    //
                    dwUnicodeChar = UTF8;
                    nTB--;
                } else 
                {
                    if (bCheckInvalidBytes) 
                    {
                        SetLastError(ERROR_NO_UNICODE_TRANSLATION);
                        return (0);
                    }
                }
            }
        }
        pUTF8++;
    }

    if ((bCheckInvalidBytes && nTB != 0) || (cchWC == 0)) 
    {
        // About (cchWC == 0):
        // Because we now throw away non-shortest form, it is possible that we generate 0 chars.
        // In this case, we have to set error to ERROR_NO_UNICODE_TRANSLATION so that we conform
        // to the spec of MultiByteToWideChar.
        SetLastError(ERROR_NO_UNICODE_TRANSLATION);
        return (0);
    }

    //
    //  Return the number of Unicode characters written.
    //
    return (cchWC);
}